

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O0

void erkStep_PrintMem(ARKodeMem ark_mem,FILE *outfile)

{
  int iVar1;
  FILE *in_RSI;
  int retval;
  ARKodeERKStepMem step_mem;
  FILE *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  ARKodeMem in_stack_ffffffffffffffe8;
  
  iVar1 = erkStep_AccessStepMem
                    (in_stack_ffffffffffffffe8,
                     (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     (ARKodeERKStepMem *)in_stack_ffffffffffffffd8);
  if (iVar1 == 0) {
    fprintf(in_RSI,"ERKStep: q = %i\n",(ulong)*(uint *)&in_stack_ffffffffffffffe8->user_data);
    fprintf(in_RSI,"ERKStep: p = %i\n",
            (ulong)*(uint *)((long)&in_stack_ffffffffffffffe8->user_data + 4));
    fprintf(in_RSI,"ERKStep: stages = %i\n",(ulong)(uint)in_stack_ffffffffffffffe8->itol);
    fprintf(in_RSI,"ERKStep: nfe = %li\n",in_stack_ffffffffffffffe8->Sabstol);
    fprintf(in_RSI,"ERKStep: Butcher table:\n");
    ARKodeButcherTable_Write
              ((ARKodeButcherTable)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void erkStep_PrintMem(ARKodeMem ark_mem, FILE* outfile)
{
  ARKodeERKStepMem step_mem;
  int retval;

#ifdef SUNDIALS_DEBUG_PRINTVEC
  int i;
#endif

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return; }

  /* output integer quantities */
  fprintf(outfile, "ERKStep: q = %i\n", step_mem->q);
  fprintf(outfile, "ERKStep: p = %i\n", step_mem->p);
  fprintf(outfile, "ERKStep: stages = %i\n", step_mem->stages);

  /* output long integer quantities */
  fprintf(outfile, "ERKStep: nfe = %li\n", step_mem->nfe);

  /* output sunrealtype quantities */
  fprintf(outfile, "ERKStep: Butcher table:\n");
  ARKodeButcherTable_Write(step_mem->B, outfile);

#ifdef SUNDIALS_DEBUG_PRINTVEC
  /* output vector quantities */
  for (i = 0; i < step_mem->stages; i++)
  {
    fprintf(outfile, "ERKStep: F[%i]:\n", i);
    N_VPrintFile(step_mem->F[i], outfile);
  }
#endif
}